

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O2

void __thiscall
agge::tests::PathGeneratorAdapterTests::EmptySourcePathAddsNothingToGenerator
          (PathGeneratorAdapterTests *this)

{
  passthrough_generator *in_RCX;
  allocator local_f1;
  path_commands local_f0;
  int local_ec;
  string local_e8;
  real_t y;
  real_t x;
  LocationInfo local_c0;
  path local_98;
  undefined8 local_78;
  path empty;
  path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
  pg;
  
  empty.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  empty.position = 0;
  empty.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.position = 0;
  local_98.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78 = 0x3f8000003f800000;
  assist<agge::tests::mocks::path,agge::tests::(anonymous_namespace)::passthrough_generator>
            (&pg,(agge *)&empty,&local_98,in_RCX);
  local_f0 = path_command_stop;
  local_ec = path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
             ::vertex(&pg,&x,&y);
  std::__cxx11::string::string
            ((string *)&local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,&local_f1);
  ut::LocationInfo::LocationInfo(&local_c0,&local_e8,0x39);
  ut::are_equal<agge::path_commands,int>(&local_f0,&local_ec,&local_c0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,(allocator *)&local_f0);
  ut::LocationInfo::LocationInfo(&local_c0,&local_e8,0x3c);
  ut::
  is_empty<std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            (&local_98.points,&local_c0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  ~_Vector_base((_Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 *)&pg);
  std::
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  ~_Vector_base((_Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 *)&local_98);
  std::
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  ~_Vector_base((_Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 *)&empty);
  return;
}

Assistant:

test( EmptySourcePathAddsNothingToGenerator )
			{
				// INIT
				const mocks::path empty;
				passthrough_generator g(1.0f, 1.0f);
				real_t x, y;

				// INIT / ACT
				path_generator_adapter<mocks::path, passthrough_generator> pg = assist(empty, g);

				// ACT / ASSERT
				assert_equal(path_command_stop, (int)pg.vertex(&x, &y));

				// ASSERT
				assert_is_empty(g.points);
			}